

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.cpp
# Opt level: O0

void __thiscall llvm::sys::MutexImpl::MutexImpl(MutexImpl *this,bool recursive)

{
  int iVar1;
  int kind;
  int errorcode;
  pthread_mutexattr_t attr;
  pthread_mutex_t *mutex;
  MutexImpl *pMStack_10;
  bool recursive_local;
  MutexImpl *this_local;
  
  this->data_ = (void *)0x0;
  mutex._7_1_ = recursive;
  pMStack_10 = this;
  _errorcode = (pthread_mutex_t *)safe_malloc(0x28);
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&kind);
  if (iVar1 != 0) {
    __assert_fail("errorcode == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Mutex.cpp"
                  ,0x38,"llvm::sys::MutexImpl::MutexImpl(bool)");
  }
  iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&kind,(uint)((mutex._7_1_ & 1) != 0));
  if (iVar1 != 0) {
    __assert_fail("errorcode == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Mutex.cpp"
                  ,0x3e,"llvm::sys::MutexImpl::MutexImpl(bool)");
  }
  iVar1 = pthread_mutex_init(_errorcode,(pthread_mutexattr_t *)&kind);
  if (iVar1 != 0) {
    __assert_fail("errorcode == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Mutex.cpp"
                  ,0x42,"llvm::sys::MutexImpl::MutexImpl(bool)");
  }
  iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&kind);
  if (iVar1 == 0) {
    this->data_ = _errorcode;
    return;
  }
  __assert_fail("errorcode == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Mutex.cpp"
                ,0x46,"llvm::sys::MutexImpl::MutexImpl(bool)");
}

Assistant:

MutexImpl::MutexImpl( bool recursive)
  : data_(nullptr)
{
  // Declare the pthread_mutex data structures
  pthread_mutex_t* mutex =
    static_cast<pthread_mutex_t*>(safe_malloc(sizeof(pthread_mutex_t)));

  pthread_mutexattr_t attr;

  // Initialize the mutex attributes
  int errorcode = pthread_mutexattr_init(&attr);
  assert(errorcode == 0); (void)errorcode;

  // Initialize the mutex as a recursive mutex, if requested, or normal
  // otherwise.
  int kind = ( recursive  ? PTHREAD_MUTEX_RECURSIVE : PTHREAD_MUTEX_NORMAL );
  errorcode = pthread_mutexattr_settype(&attr, kind);
  assert(errorcode == 0); (void)errorcode;

  // Initialize the mutex
  errorcode = pthread_mutex_init(mutex, &attr);
  assert(errorcode == 0); (void)errorcode;

  // Destroy the attributes
  errorcode = pthread_mutexattr_destroy(&attr);
  assert(errorcode == 0); (void)errorcode;

  // Assign the data member
  data_ = mutex;
}